

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::FinalizeBindOrderExpression
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogicalTypeId LVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar3;
  undefined8 uVar4;
  pointer pEVar5;
  BoundConstantExpression *pBVar6;
  uint64_t uVar7;
  idx_t index;
  vector<duckdb::Value,_true> *this_01;
  const_reference pvVar8;
  const_reference pvVar9;
  InternalException *pIVar10;
  BinderException *this_02;
  type expr_00;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  string collation;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  string local_b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  string local_88;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar5->super_BaseExpression);
  LVar2 = (pBVar6->value).type_.id_;
  if (LVar2 == VARCHAR) {
    *(undefined8 *)this = 0;
  }
  else if (LVar2 == STRUCT) {
    this_01 = StructValue::GetChildren(&pBVar6->value);
    if (0x80 < (ulong)((long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Expected one or two children: index and optional collation",""
                );
      InternalException::InternalException(pIVar10,&local_b0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar8 = vector<duckdb::Value,_true>::operator[](this_01,0);
    uVar7 = UBigIntValue::Get(pvVar8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if ((long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this_01->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start == 0x80) {
      pvVar8 = vector<duckdb::Value,_true>::operator[](this_01,1);
      StringValue::Get_abi_cxx11_(pvVar8);
      ::std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    local_90._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    CreateOrderExpression
              (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )&local_90,names,sql_types,table_index,uVar7);
    paVar1 = &local_b0.field_2;
    if (local_90._M_head_impl != (Expression *)0x0) {
      (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_90._M_head_impl = (Expression *)0x0;
    if (local_b0._M_string_length != 0) {
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[](sql_types,uVar7);
      if (pvVar9->id_ != VARCHAR) {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"COLLATE can only be applied to varchar columns","");
        BinderException::BinderException<>(this_02,expr_00,&local_88);
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar1) {
        local_68.field_2._8_8_ = local_b0.field_2._8_8_;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_68.field_2._M_allocated_capacity._1_7_ = local_b0.field_2._M_allocated_capacity._1_7_;
      local_68.field_2._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
      local_68._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      LogicalType::VARCHAR_COLLATION((LogicalType *)&local_88,&local_68);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      uVar4 = local_88.field_2._M_allocated_capacity;
      sVar3 = local_88._M_string_length;
      (pEVar5->return_type).id_ = (LogicalTypeId)local_88._M_dataplus._M_p;
      (pEVar5->return_type).physical_type_ = local_88._M_dataplus._M_p._1_1_;
      uVar11 = *(undefined4 *)
                &(pEVar5->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar12 = *(undefined4 *)
                ((long)&(pEVar5->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar13 = *(undefined4 *)
                &(pEVar5->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar14 = *(undefined4 *)
                ((long)&(pEVar5->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity = 0;
      this_00 = (pEVar5->return_type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)sVar3;
      (pEVar5->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_48 = uVar11;
        uStack_44 = uVar12;
        uStack_40 = uVar13;
        uStack_3c = uVar14;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        uVar11 = local_48;
        uVar12 = uStack_44;
        uVar13 = uStack_40;
        uVar14 = uStack_3c;
      }
      uVar4 = local_88.field_2._M_allocated_capacity;
      local_88._M_string_length = CONCAT44(uVar12,uVar11);
      local_88.field_2._M_allocated_capacity._4_4_ = uVar14;
      local_88.field_2._M_allocated_capacity._0_4_ = uVar13;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
      }
      LogicalType::~LogicalType((LogicalType *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    if (LVar2 != UBIGINT) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Unknown type in FinalizeBindOrderExpression","");
      InternalException::InternalException(pIVar10,&local_b0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar7 = UBigIntValue::Get(&pBVar6->value);
    local_b8._M_head_impl =
         (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
         .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    index = SelectBindState::GetFinalIndex(bind_state,uVar7);
    CreateOrderExpression
              (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )&local_b8,names,sql_types,table_index,index);
    if (local_b8._M_head_impl != (Expression *)0x0) {
      (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> FinalizeBindOrderExpression(unique_ptr<Expression> expr, idx_t table_index,
                                                   const vector<string> &names, const vector<LogicalType> &sql_types,
                                                   const SelectBindState &bind_state) {
	auto &constant = expr->Cast<BoundConstantExpression>();
	switch (constant.value.type().id()) {
	case LogicalTypeId::UBIGINT: {
		// index
		auto index = UBigIntValue::Get(constant.value);
		return CreateOrderExpression(std::move(expr), names, sql_types, table_index, bind_state.GetFinalIndex(index));
	}
	case LogicalTypeId::VARCHAR: {
		// ORDER BY ALL
		return nullptr;
	}
	case LogicalTypeId::STRUCT: {
		// collation
		auto &struct_values = StructValue::GetChildren(constant.value);
		if (struct_values.size() > 2) {
			throw InternalException("Expected one or two children: index and optional collation");
		}
		auto index = UBigIntValue::Get(struct_values[0]);
		string collation;
		if (struct_values.size() == 2) {
			collation = StringValue::Get(struct_values[1]);
		}
		auto result = CreateOrderExpression(std::move(expr), names, sql_types, table_index, index);
		if (!collation.empty()) {
			if (sql_types[index].id() != LogicalTypeId::VARCHAR) {
				throw BinderException(*result, "COLLATE can only be applied to varchar columns");
			}
			result->return_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
		}
		return result;
	}
	default:
		throw InternalException("Unknown type in FinalizeBindOrderExpression");
	}
}